

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureProjected
               (SurfaceAccess *dst,Texture3DView *rawSrc,Vec4 *sq,Vec4 *tq,Vec4 *rq,
               ReferenceParams *params)

{
  LodMode mode;
  float fVar1;
  float wx_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  Texture3DView TVar7;
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_20c;
  Texture3DView local_1f4;
  Vector<float,_4> local_1e4;
  Vec4 local_1d4;
  float local_1c4;
  float local_1c0;
  float lod;
  float r;
  float t;
  float s;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  int px;
  int py;
  Vec3 triP [2];
  undefined1 local_168 [8];
  Vec3 triW [2];
  undefined1 local_148 [8];
  Vec3 triV [2];
  undefined1 local_128 [8];
  Vec3 triU [2];
  undefined1 local_108 [8];
  Vec3 triR [2];
  undefined1 local_e8 [8];
  Vec3 triT [2];
  undefined1 local_c8 [8];
  Vec3 triS [2];
  tcu local_a8 [8];
  Vec4 wq;
  Vec4 vq;
  Vec4 uq;
  float dstH;
  float dstW;
  float lodBias;
  undefined1 local_60 [8];
  Texture3DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *params_local;
  Vec4 *rq_local;
  Vec4 *tq_local;
  Vec4 *sq_local;
  Texture3DView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar7 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar7.m_levels;
  local_60._0_4_ = TVar7.m_numLevels;
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_20c = 0.0;
  }
  else {
    local_20c = (params->super_RenderParams).bias;
  }
  iVar2 = tcu::SurfaceAccess::getWidth(dst);
  iVar3 = tcu::SurfaceAccess::getHeight(dst);
  iVar4 = tcu::Texture3DView::getWidth((Texture3DView *)local_60);
  tcu::operator*((tcu *)(vq.m_data + 2),sq,(float)iVar4);
  iVar4 = tcu::Texture3DView::getHeight((Texture3DView *)local_60);
  tcu::operator*((tcu *)(wq.m_data + 2),tq,(float)iVar4);
  iVar4 = tcu::Texture3DView::getDepth((Texture3DView *)local_60);
  tcu::operator*(local_a8,rq,(float)iVar4);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_c8,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_e8,(int)tq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)tq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_108,(int)rq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)rq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_128,(int)&vq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triU[0].m_data + 1),(int)&vq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_148,(int)&wq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triV[0].m_data + 1),(int)&wq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_168,(int)local_a8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triW[0].m_data + 1),(int)local_a8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&px,(int)params + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triP[0].m_data + 1),(int)params + 0xc,3,2);
  for (wx = 0.0; fVar1 = wx, iVar4 = tcu::SurfaceAccess::getHeight(dst), (int)fVar1 < iVar4;
      wx = (float)((int)wx + 1)) {
    for (wy = 0.0; fVar1 = wy, iVar4 = tcu::SurfaceAccess::getWidth(dst), (int)fVar1 < iVar4;
        wy = (float)((int)wy + 1)) {
      nx = (float)(int)wy + 0.5;
      ny = (float)(int)wx + 0.5;
      triNdx = (int)(nx / (float)iVar2);
      triWx = ny / (float)iVar3;
      triWy = (float)(uint)(1.0 <= (float)triNdx + triWx);
      local_254 = nx;
      if (triWy != 0.0) {
        local_254 = (float)iVar2 - nx;
      }
      triNx = local_254;
      local_258 = ny;
      if (triWy != 0.0) {
        local_258 = (float)iVar3 - ny;
      }
      triNy = local_258;
      local_25c = (float)triNdx;
      if (triWy != 0.0) {
        local_25c = 1.0 - (float)triNdx;
      }
      s = local_25c;
      local_260 = triWx;
      if (triWy != 0.0) {
        local_260 = 1.0 - triWx;
      }
      t = local_260;
      r = projectedTriInterpolate
                    ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                     (Vec3 *)(&px + (long)(int)triWy * 3),local_25c,local_260);
      lod = projectedTriInterpolate
                      ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                       (Vec3 *)(&px + (long)(int)triWy * 3),s,t);
      local_1c0 = projectedTriInterpolate
                            ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                             (Vec3 *)(&px + (long)(int)triWy * 3),s,t);
      wx_00 = triNx;
      fVar1 = triNy;
      mode = params->lodMode;
      lVar6 = (long)(int)triWy;
      iVar4 = tcu::SurfaceAccess::getWidth(dst);
      iVar5 = tcu::SurfaceAccess::getHeight(dst);
      local_1c4 = computeProjectedTriLod
                            (mode,(Vec3 *)(triU[lVar6 + -1].m_data + 1),
                             (Vec3 *)(triV[lVar6 + -1].m_data + 1),
                             (Vec3 *)(triW[lVar6 + -1].m_data + 1),(Vec3 *)(&px + lVar6 * 3),wx_00,
                             fVar1,(float)iVar4,(float)iVar5);
      local_1c4 = local_1c4 + local_20c;
      tcu::Texture3DView::sample(&local_1f4,(Sampler *)local_60,r,lod,local_1c0,local_1c4);
      tcu::operator*((tcu *)&local_1e4,(Vector<float,_4> *)&local_1f4,
                     &(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_1d4,&local_1e4,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_1d4,(int)wy,(int)wx);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureProjected (const tcu::SurfaceAccess& dst, const tcu::Texture3DView& rawSrc, const tcu::Vec4& sq, const tcu::Vec4& tq, const tcu::Vec4& rq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture3DView					src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	float										lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;
	float										dstW				= (float)dst.getWidth();
	float										dstH				= (float)dst.getHeight();

	tcu::Vec4									uq					= sq * (float)src.getWidth();
	tcu::Vec4									vq					= tq * (float)src.getHeight();
	tcu::Vec4									wq					= rq * (float)src.getDepth();

	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	tcu::Vec3									triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	tcu::Vec3									triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	tcu::Vec3									triU[2]				= { uq.swizzle(0, 1, 2), uq.swizzle(3, 2, 1) };
	tcu::Vec3									triV[2]				= { vq.swizzle(0, 1, 2), vq.swizzle(3, 2, 1) };
	tcu::Vec3									triW[2]				= { wq.swizzle(0, 1, 2), wq.swizzle(3, 2, 1) };
	tcu::Vec3									triP[2]				= { params.w.swizzle(0, 1, 2), params.w.swizzle(3, 2, 1) };

	for (int py = 0; py < dst.getHeight(); py++)
	{
		for (int px = 0; px < dst.getWidth(); px++)
		{
			float	wx		= (float)px + 0.5f;
			float	wy		= (float)py + 0.5f;
			float	nx		= wx / dstW;
			float	ny		= wy / dstH;

			int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
			float	triWx	= triNdx ? dstW - wx : wx;
			float	triWy	= triNdx ? dstH - wy : wy;
			float	triNx	= triNdx ? 1.0f - nx : nx;
			float	triNy	= triNdx ? 1.0f - ny : ny;

			float	s		= projectedTriInterpolate(triS[triNdx], triP[triNdx], triNx, triNy);
			float	t		= projectedTriInterpolate(triT[triNdx], triP[triNdx], triNx, triNy);
			float	r		= projectedTriInterpolate(triR[triNdx], triP[triNdx], triNx, triNy);
			float	lod		= computeProjectedTriLod(params.lodMode, triU[triNdx], triV[triNdx], triW[triNdx], triP[triNdx], triWx, triWy, (float)dst.getWidth(), (float)dst.getHeight())
							+ lodBias;

			dst.setPixel(src.sample(params.sampler, s, t, r, lod) * params.colorScale + params.colorBias, px, py);
		}
	}
}